

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.h
# Opt level: O0

function<void_()> * __thiscall
Console::bindCallback<std::__cxx11::string,std::__cxx11::string>
          (function<void_()> *__return_storage_ptr__,Console *this,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *callback,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,int argumentIndex)

{
  const_reference s;
  undefined1 local_d8 [48];
  anon_class_64_2_4fe94ccd local_a8;
  undefined1 local_68 [8];
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  nextCallback;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  int argumentIndex_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *callback_local;
  
  s = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)callback,(long)(int)arguments);
  argumentConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::convert((argumentConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&nextCallback._M_invoker,s);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)(local_d8 + 0x30),
             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)this);
  std::__cxx11::string::string((string *)&local_a8.value,(string *)&nextCallback._M_invoker);
  std::function<void(std::__cxx11::string)>::
  function<Console::bindCallback<std::__cxx11::string,std::__cxx11::string>(std::function<void(std::__cxx11::string,std::__cxx11::string)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)::_lambda(std::__cxx11::string)_1_,void>
            ((function<void(std::__cxx11::string)> *)local_68,
             (anon_class_64_2_4fe94ccd *)(local_d8 + 0x30));
  bindCallback<std::__cxx11::string,std::__cxx11::string>(std::function<void(std::__cxx11::string,std::__cxx11::string)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)
  ::{lambda(std::__cxx11::string)#1}::~vector((_lambda_std____cxx11__string__1_ *)(local_d8 + 0x30))
  ;
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)local_d8,
           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)local_68);
  bindCallback<std::__cxx11::string>
            (__return_storage_ptr__,(Console *)local_d8,
             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)callback,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(ulong)((int)arguments + 1),argumentIndex);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)local_d8);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)local_68);
  std::__cxx11::string::~string((string *)&nextCallback._M_invoker);
  return __return_storage_ptr__;
}

Assistant:

std::function<void()> Console::bindCallback(std::function<void(T, Args...)> callback, const std::vector<std::string> &arguments, int argumentIndex)
{
    T value = argumentConverter<T>::convert(arguments.at(argumentIndex));
    std::function<void(Args...)> nextCallback = [callback, value](Args... args) {
        callback(value, args...);
    };
    return bindCallback(nextCallback, arguments, argumentIndex + 1);
}